

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlif.c
# Opt level: O1

int Io_ReadBlifNetworkConnectBoxesOne(Io_ReadBlif_t *p,Abc_Ntk_t *pNtk,stmm_table *tName2Model)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  long lVar3;
  
  pVVar2 = pNtk->vBoxes;
  if (0 < pVVar2->nSize) {
    lVar3 = 0;
    do {
      if (((*(uint *)&((Abc_Obj_t *)pVVar2->pArray[lVar3])->field_0x14 & 0xf) == 10) &&
         (iVar1 = Io_ReadBlifNetworkConnectBoxesOneBox
                            (p,(Abc_Obj_t *)pVVar2->pArray[lVar3],tName2Model), iVar1 != 0)) {
        return 1;
      }
      lVar3 = lVar3 + 1;
      pVVar2 = pNtk->vBoxes;
    } while (lVar3 < pVVar2->nSize);
  }
  Abc_NtkFinalizeRead(pNtk);
  return 0;
}

Assistant:

int Io_ReadBlifNetworkConnectBoxesOne( Io_ReadBlif_t * p, Abc_Ntk_t * pNtk, stmm_table * tName2Model )
{
    Abc_Obj_t * pBox;
    int i;
    // go through the boxes
    Abc_NtkForEachBlackbox( pNtk, pBox, i )
        if ( Io_ReadBlifNetworkConnectBoxesOneBox( p, pBox, tName2Model ) )
            return 1;
    Abc_NtkFinalizeRead( pNtk );
    return 0;
}